

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorImport(VP8EncIterator *it,uint8_t *tmp_32)

{
  int iVar1;
  int iVar2;
  WebPPicture *pWVar3;
  uint8_t *puVar4;
  uint h;
  uint8_t uVar5;
  int iVar6;
  uint8_t *src;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint8_t *src_00;
  uint8_t *puVar10;
  uint8_t *src_01;
  uint uVar11;
  uint uVar12;
  uint w;
  uint h_00;
  
  iVar1 = it->x_;
  iVar2 = it->y_;
  pWVar3 = it->enc_->pic_;
  src_01 = pWVar3->y + (pWVar3->y_stride * iVar2 + iVar1) * 0x10;
  iVar6 = (pWVar3->uv_stride * iVar2 + iVar1) * 8;
  src_00 = pWVar3->u + iVar6;
  src = pWVar3->v + iVar6;
  uVar11 = pWVar3->width + iVar1 * -0x10;
  uVar7 = 0x10;
  if ((int)uVar11 < 0x10) {
    uVar7 = (ulong)uVar11;
  }
  uVar12 = pWVar3->height + iVar2 * -0x10;
  h = 0x10;
  if ((int)uVar12 < 0x10) {
    h = uVar12;
  }
  iVar6 = (int)uVar7;
  w = iVar6 + 1 >> 1;
  h_00 = (int)(h + 1) >> 1;
  ImportBlock(src_01,pWVar3->y_stride,it->yuv_in_,iVar6,h,0x10);
  ImportBlock(src_00,pWVar3->uv_stride,it->yuv_in_ + 0x10,w,h_00,8);
  ImportBlock(src,pWVar3->uv_stride,it->yuv_in_ + 0x18,w,h_00,8);
  if (tmp_32 != (uint8_t *)0x0) {
    if (iVar1 == 0) {
      InitLeft(it);
    }
    else {
      if (iVar2 == 0) {
        uVar5 = '\x7f';
        it->v_left_[-1] = '\x7f';
        it->u_left_[-1] = '\x7f';
        lVar8 = 0x168;
      }
      else {
        it->y_left_[-1] = src_01[~(long)pWVar3->y_stride];
        it->u_left_[-1] = src_00[~(long)pWVar3->uv_stride];
        uVar5 = src[~(long)pWVar3->uv_stride];
        lVar8 = 0x178;
      }
      *(uint8_t *)(*(long *)(it->i4_boundary_ + lVar8 + -0x50) + -1) = uVar5;
      puVar4 = it->y_left_;
      if ((int)uVar12 < 1) {
        uVar9 = 0;
      }
      else {
        iVar1 = pWVar3->y_stride;
        puVar10 = src_01 + -1;
        uVar9 = 0;
        do {
          puVar4[uVar9] = *puVar10;
          uVar9 = uVar9 + 1;
          puVar10 = puVar10 + iVar1;
        } while (h != uVar9);
      }
      if ((int)uVar9 < 0x10) {
        uVar9 = uVar9 & 0xffffffff;
        do {
          puVar4[uVar9] = puVar4[(long)(int)h + -1];
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x10);
      }
      puVar4 = it->u_left_;
      if ((int)h_00 < 1) {
        uVar9 = 0;
      }
      else {
        iVar1 = pWVar3->uv_stride;
        puVar10 = src_00 + -1;
        uVar9 = 0;
        do {
          puVar4[uVar9] = *puVar10;
          uVar9 = uVar9 + 1;
          puVar10 = puVar10 + iVar1;
        } while (h_00 != uVar9);
      }
      if ((int)uVar9 < 8) {
        uVar9 = uVar9 & 0xffffffff;
        do {
          puVar4[uVar9] = puVar4[(long)(int)h_00 + -1];
          uVar9 = uVar9 + 1;
        } while (uVar9 != 8);
      }
      puVar4 = it->v_left_;
      if ((int)h_00 < 1) {
        uVar9 = 0;
      }
      else {
        iVar1 = pWVar3->uv_stride;
        puVar10 = src + -1;
        uVar9 = 0;
        do {
          puVar4[uVar9] = *puVar10;
          uVar9 = uVar9 + 1;
          puVar10 = puVar10 + iVar1;
        } while (h_00 != uVar9);
      }
      if ((int)uVar9 < 8) {
        uVar9 = uVar9 & 0xffffffff;
        do {
          puVar4[uVar9] = puVar4[(long)(int)h_00 + -1];
          uVar9 = uVar9 + 1;
        } while (uVar9 != 8);
      }
    }
    it->y_top_ = tmp_32;
    it->uv_top_ = tmp_32 + 0x10;
    if (iVar2 == 0) {
      builtin_memcpy(tmp_32,
                     "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                     ,0x20);
    }
    else {
      if ((int)uVar11 < 1) {
        uVar9 = 0;
      }
      else {
        iVar1 = pWVar3->y_stride;
        uVar9 = 0;
        do {
          tmp_32[uVar9] = src_01[uVar9 - (long)iVar1];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      if ((int)uVar9 < 0x10) {
        uVar9 = uVar9 & 0xffffffff;
        do {
          tmp_32[uVar9] = tmp_32[(long)iVar6 + -1];
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x10);
      }
      if ((int)w < 1) {
        uVar7 = 0;
      }
      else {
        iVar1 = pWVar3->uv_stride;
        uVar7 = 0;
        do {
          (tmp_32 + 0x10)[uVar7] = src_00[uVar7 - (long)iVar1];
          uVar7 = uVar7 + 1;
        } while (w != uVar7);
      }
      if ((int)uVar7 < 8) {
        uVar7 = uVar7 & 0xffffffff;
        do {
          tmp_32[uVar7 + 0x10] = tmp_32[(long)(int)w + 0xf];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 8);
      }
      if ((int)w < 1) {
        uVar7 = 0;
      }
      else {
        iVar1 = pWVar3->uv_stride;
        uVar7 = 0;
        do {
          tmp_32[uVar7 + 0x18] = src[uVar7 - (long)iVar1];
          uVar7 = uVar7 + 1;
        } while (w != uVar7);
      }
      if ((int)uVar7 < 8) {
        uVar7 = uVar7 & 0xffffffff;
        do {
          tmp_32[uVar7 + 0x18] = tmp_32[(long)(int)w + 0x17];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 8);
      }
    }
  }
  return;
}

Assistant:

void VP8IteratorImport(VP8EncIterator* const it, uint8_t* const tmp_32) {
  const VP8Encoder* const enc = it->enc_;
  const int x = it->x_, y = it->y_;
  const WebPPicture* const pic = enc->pic_;
  const uint8_t* const ysrc = pic->y + (y * pic->y_stride  + x) * 16;
  const uint8_t* const usrc = pic->u + (y * pic->uv_stride + x) * 8;
  const uint8_t* const vsrc = pic->v + (y * pic->uv_stride + x) * 8;
  const int w = MinSize(pic->width - x * 16, 16);
  const int h = MinSize(pic->height - y * 16, 16);
  const int uv_w = (w + 1) >> 1;
  const int uv_h = (h + 1) >> 1;

  ImportBlock(ysrc, pic->y_stride,  it->yuv_in_ + Y_OFF_ENC, w, h, 16);
  ImportBlock(usrc, pic->uv_stride, it->yuv_in_ + U_OFF_ENC, uv_w, uv_h, 8);
  ImportBlock(vsrc, pic->uv_stride, it->yuv_in_ + V_OFF_ENC, uv_w, uv_h, 8);

  if (tmp_32 == NULL) return;

  // Import source (uncompressed) samples into boundary.
  if (x == 0) {
    InitLeft(it);
  } else {
    if (y == 0) {
      it->y_left_[-1] = it->u_left_[-1] = it->v_left_[-1] = 127;
    } else {
      it->y_left_[-1] = ysrc[- 1 - pic->y_stride];
      it->u_left_[-1] = usrc[- 1 - pic->uv_stride];
      it->v_left_[-1] = vsrc[- 1 - pic->uv_stride];
    }
    ImportLine(ysrc - 1, pic->y_stride,  it->y_left_, h,   16);
    ImportLine(usrc - 1, pic->uv_stride, it->u_left_, uv_h, 8);
    ImportLine(vsrc - 1, pic->uv_stride, it->v_left_, uv_h, 8);
  }

  it->y_top_  = tmp_32 + 0;
  it->uv_top_ = tmp_32 + 16;
  if (y == 0) {
    memset(tmp_32, 127, 32 * sizeof(*tmp_32));
  } else {
    ImportLine(ysrc - pic->y_stride,  1, tmp_32,          w,   16);
    ImportLine(usrc - pic->uv_stride, 1, tmp_32 + 16,     uv_w, 8);
    ImportLine(vsrc - pic->uv_stride, 1, tmp_32 + 16 + 8, uv_w, 8);
  }
}